

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O0

void test_register_request_target(void)

{
  cio_http_location *pcVar1;
  cio_inet_address *arg1;
  ulong uVar2;
  register_request_target_args arg;
  uint i;
  register_request_target_args args [3];
  undefined1 local_238 [8];
  cio_http_location target;
  undefined1 local_210 [4];
  cio_error err;
  cio_http_server server;
  cio_http_server_configuration config;
  
  memcpy(server.keepalive_header + 0x20,&DAT_001238b8,0xb8);
  arg1 = cio_get_inet_address_any4();
  cio_init_inet_socket_address((cio_socket_address *)(server.keepalive_header + 0x20),arg1,0x1f90);
  target.config._4_4_ =
       cio_http_server_init
                 ((cio_http_server *)local_210,&loop,
                  (cio_http_server_configuration *)(server.keepalive_header + 0x20));
  UnityAssertEqualNumber
            (0,(long)target.config._4_4_,"Server initialization failed!",0x42f,
             UNITY_DISPLAY_STYLE_INT);
  target.config._4_4_ =
       cio_http_location_init((cio_http_location *)local_238,"/foo",(void *)0x0,alloc_dummy_handler)
  ;
  UnityAssertEqualNumber
            (0,(long)target.config._4_4_,"Request target initialization failed!",0x433,
             UNITY_DISPLAY_STYLE_INT);
  args[0].server = (cio_http_server *)local_238;
  args[0].target._0_4_ = 0;
  args[0].expected_result = CIO_SUCCESS;
  args[0]._20_4_ = 0;
  args[1].server = (cio_http_server *)local_238;
  args[1].target._0_4_ = 0xffffffea;
  args[1]._16_8_ = local_210;
  args[2].server = (cio_http_server *)0x0;
  args[2].target._0_4_ = 0xffffffea;
  for (arg._20_4_ = 0; (uint)arg._20_4_ < 3; arg._20_4_ = arg._20_4_ + 1) {
    uVar2 = (ulong)(uint)arg._20_4_;
    pcVar1 = args[uVar2].target;
    target.config._4_4_ =
         cio_http_server_register_location
                   (*(cio_http_server **)&args[uVar2 - 1].expected_result,
                    (cio_http_location *)args[uVar2].server);
    arg.target._0_4_ = (int)pcVar1;
    UnityAssertEqualNumber
              ((long)(int)arg.target,(long)target.config._4_4_,
               "Register request target not handled correctly!",0x43e,UNITY_DISPLAY_STYLE_INT);
    free_dummy_client(client_socket);
    setUp();
  }
  free_dummy_client(client_socket);
  return;
}

Assistant:

static void test_register_request_target(void)
{
	struct register_request_target_args {
		struct cio_http_server *server;
		struct cio_http_location *target;
		enum cio_error expected_result;
	};

	struct cio_http_server_configuration config = {
	    .on_error = serve_error,
	    .read_header_timeout_ns = header_read_timeout,
	    .read_body_timeout_ns = body_read_timeout,
	    .response_timeout_ns = response_timeout,
	    .close_timeout_ns = 10,
	    .alloc_client = alloc_dummy_client,
	    .free_client = free_dummy_client};

	cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

	struct cio_http_server server;
	enum cio_error err = cio_http_server_init(&server, &loop, &config);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

	struct cio_http_location target;
	err = cio_http_location_init(&target, "/foo", NULL, alloc_dummy_handler);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target initialization failed!");

	struct register_request_target_args args[] = {
	    {.server = &server, .target = &target, .expected_result = CIO_SUCCESS},
	    {.server = NULL, .target = &target, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .target = NULL, .expected_result = CIO_INVALID_ARGUMENT},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(args); i++) {
		struct register_request_target_args arg = args[i];
		err = cio_http_server_register_location(arg.server, arg.target);
		TEST_ASSERT_EQUAL_MESSAGE(arg.expected_result, err, "Register request target not handled correctly!");

		free_dummy_client(client_socket);
		setUp();
	}

	free_dummy_client(client_socket);
}